

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::setupViewport(QMdiArea *this,QWidget *viewport)

{
  long lVar1;
  bool bVar2;
  const_iterator o;
  QWidget *this_00;
  long in_RSI;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *__range1;
  QMdiAreaPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  WindowFlags in_stack_00000180;
  QList<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff80;
  const_iterator local_28;
  undefined8 in_stack_ffffffffffffffe0;
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMdiArea *)0x615b10);
  if (in_RSI != 0) {
    QBrush::isOpaque();
    QWidget::setAttribute
              (in_stack_ffffffffffffffe8,(WidgetAttribute)((ulong)in_stack_ffffffffffffffe0 >> 0x20)
               ,SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x18,0));
  }
  QList<QPointer<QMdiSubWindow>_>::QList
            ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
  ;
  local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QPointer<QMdiSubWindow>_>::begin
                       ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff80);
  o = QList<QPointer<QMdiSubWindow>_>::end
                ((QList<QPointer<QMdiSubWindow>_> *)in_stack_ffffffffffffff80);
  while (bVar2 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,o), bVar2) {
    QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
    this_00 = &::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x615c07)->
               super_QWidget;
    bVar2 = sanityCheck((QMdiSubWindow *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78
                       );
    if (bVar2) {
      QWidget::windowFlags(this_00);
      QWidget::setParent(viewport,(QWidget *)d,in_stack_00000180);
      in_stack_ffffffffffffff80 = this_00;
    }
    QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
  }
  QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x615c71);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::setupViewport(QWidget *viewport)
{
    Q_D(QMdiArea);
    if (viewport)
        viewport->setAttribute(Qt::WA_OpaquePaintEvent, d->background.isOpaque());
    // Take a copy because the child->setParent() call below may call QCoreApplication::sendEvent()
    // which may call unknown code that could e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::setupViewport"))
            continue;
        child->setParent(viewport, child->windowFlags());
    }
}